

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void benchmark::RunSpecifiedBenchmarks(BenchmarkReporter *reporter)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  undefined1 auVar4 [16];
  pointer ptVar5;
  int64_t iVar6;
  int64_t iVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  pointer pTVar11;
  __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
  *this;
  Mutex *__m;
  Instance *benchmark_1;
  undefined *puVar12;
  pointer pIVar13;
  Instance *benchmark;
  pointer pIVar14;
  __pthread_internal_list *iters;
  pointer __p_00;
  ulong uVar15;
  pointer __p;
  pointer ptVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  ulong uVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar25;
  int iVar28;
  int iVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar30;
  undefined1 auVar31 [16];
  BenchmarkReporter *local_260;
  double local_248;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  string label;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks_1;
  MutexLock l;
  undefined1 local_1c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  int64_t local_198;
  double local_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  double local_170;
  ThreadStats total;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  reports;
  string spec;
  string mem;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks;
  condition_variable local_90 [64];
  int local_50;
  double local_48;
  undefined1 local_40;
  double local_38;
  
  if (FLAGS_benchmark_list_tests) {
    benchmarks.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    benchmarks.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    benchmarks.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    internal::BenchmarkFamilies::GetInstance();
    std::__cxx11::string::string((string *)&l,".",(allocator *)&mem);
    bVar8 = internal::BenchmarkFamilies::FindBenchmarks
                      (&internal::BenchmarkFamilies::GetInstance::instance,(string *)&l,&benchmarks)
    ;
    std::__cxx11::string::~string((string *)&l);
    pIVar13 = benchmarks.
              super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pIVar14 = benchmarks.
              super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (bVar8) {
      for (; pIVar14 != pIVar13; pIVar14 = pIVar14 + 1) {
        poVar10 = std::operator<<((ostream *)&std::cout,(string *)pIVar14);
        std::operator<<(poVar10,"\n");
      }
    }
    std::
    vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ::~vector(&benchmarks);
    return;
  }
  std::__cxx11::string::string((string *)&spec,(string *)&FLAGS_benchmark_filter_abi_cxx11_);
  if ((spec._M_string_length == 0) || (bVar8 = std::operator==(&spec,"all"), bVar8)) {
    std::__cxx11::string::assign((char *)&spec);
  }
  if (reporter == (BenchmarkReporter *)0x0) {
    bVar8 = std::operator==(&FLAGS_benchmark_format_abi_cxx11_,"tabular");
    if (bVar8) {
      reporter = (BenchmarkReporter *)operator_new(0x10);
      puVar12 = &ConsoleReporter::vtable;
    }
    else {
      bVar8 = std::operator==(&FLAGS_benchmark_format_abi_cxx11_,"json");
      if (bVar8) {
        reporter = (BenchmarkReporter *)operator_new(0x10);
        reporter->_vptr_BenchmarkReporter = (_func_int **)&PTR_ReportContext_00129990;
        *(undefined1 *)&reporter[1]._vptr_BenchmarkReporter = 1;
        local_260 = reporter;
        goto LAB_00108fd4;
      }
      bVar8 = std::operator==(&FLAGS_benchmark_format_abi_cxx11_,"csv");
      if (!bVar8) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Unexpected format: \'");
        poVar10 = std::operator<<(poVar10,(string *)&FLAGS_benchmark_format_abi_cxx11_);
        std::operator<<(poVar10,"\'\n");
        exit(1);
      }
      reporter = (BenchmarkReporter *)operator_new(8);
      puVar12 = &CSVReporter::vtable;
    }
    reporter->_vptr_BenchmarkReporter = (_func_int **)(puVar12 + 0x10);
    local_260 = reporter;
  }
  else {
    local_260 = (BenchmarkReporter *)0x0;
  }
LAB_00108fd4:
  internal::GetNullLogInstance();
  if (spec._M_string_length != 0) {
    benchmarks_1.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    benchmarks_1.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    benchmarks_1.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    internal::BenchmarkFamilies::GetInstance();
    bVar8 = internal::BenchmarkFamilies::FindBenchmarks
                      (&internal::BenchmarkFamilies::GetInstance::instance,&spec,&benchmarks_1);
    if (bVar8) {
      dVar19 = 4.94065645841247e-323;
      for (pIVar13 = benchmarks_1.
                     super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pIVar13 !=
          benchmarks_1.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish; pIVar13 = pIVar13 + 1) {
        dVar25 = (double)(pIVar13->name)._M_string_length;
        if ((ulong)dVar19 <= (ulong)dVar25) {
          dVar19 = dVar25;
        }
      }
      dVar25 = (double)((long)dVar19 + 7);
      if (FLAGS_benchmark_repetitions < 2) {
        dVar25 = dVar19;
      }
      local_50 = NumCPUs();
      local_48 = CyclesPerSecond();
      local_48 = local_48 / 1000000.0;
      local_40 = CpuScalingEnabled();
      local_38 = dVar25;
      iVar9 = (**reporter->_vptr_BenchmarkReporter)(reporter);
      pIVar13 = benchmarks_1.
                super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((char)iVar9 != '\0') {
        for (pIVar14 = benchmarks_1.
                       super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                       ._M_impl.super__Vector_impl_data._M_start; pIVar14 != pIVar13;
            pIVar14 = pIVar14 + 1) {
          reports.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          reports.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          reports.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pIVar14->multithreaded == true) {
            std::vector<std::thread,_std::allocator<std::thread>_>::resize
                      (&pool,(long)pIVar14->threads);
          }
          iters = (__pthread_internal_list *)0x1;
          for (iVar9 = 0; iVar9 < FLAGS_benchmark_repetitions; iVar9 = iVar9 + 1) {
            mem._M_dataplus._M_p = (pointer)&mem.field_2;
            mem._M_string_length = 0;
            mem.field_2._M_local_buf[0] = '\0';
            do {
              poVar10 = internal::GetLogInstanceForLevel(2);
              poVar10 = std::operator<<(poVar10,"-- LOG(");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
              poVar10 = std::operator<<(poVar10,"): ");
              poVar10 = std::operator<<(poVar10,"Running ");
              poVar10 = std::operator<<(poVar10,(string *)pIVar14);
              poVar10 = std::operator<<(poVar10," for ");
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::operator<<(poVar10,"\n");
              pTVar11 = (pointer)GetBenchmarkLock();
              std::unique_lock<std::mutex>::unique_lock(&l.ml_,(mutex_type *)pTVar11);
              (anonymous_namespace)::GetReportLabel_abi_cxx11_();
              (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_string_length
                   = 0;
              *(anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_dataplus._M_p
                   = '\0';
              std::unique_lock<std::mutex>::~unique_lock(&l.ml_);
              Notification::Notification((Notification *)&benchmarks);
              this = (__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                      *)operator_new(0xa0);
              iVar28 = pIVar14->threads;
              this[4]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[2]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[3]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              (this->_M_t).
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[1]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              std::condition_variable::condition_variable((condition_variable *)(this + 5));
              *(int *)&this[0xb]._M_t.
                       super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                       .
                       super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                       ._M_head_impl = iVar28;
              this[0xc]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)&benchmarks;
              *(undefined1 *)
               &this[0xd]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = 0;
              this[0x10]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              this[0x11]._M_t.
              super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
              _M_head_impl = (TimerManager *)0x0;
              *(undefined8 *)
               ((long)&this[0x11]._M_t.
                       super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                       .
                       super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                       ._M_head_impl + 4) = 0;
              *(undefined8 *)
               ((long)&this[0x12]._M_t.
                       super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                       .
                       super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                       ._M_head_impl + 4) = 0;
              l.ml_._M_device = (mutex_type *)0x0;
              std::
              __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              ::reset(this,pTVar11);
              std::
              unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              ::~unique_ptr((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                             *)&l.ml_);
              ptVar5 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              total.bytes_processed = 0;
              total.items_processed = 0;
              (anonymous_namespace)::running_benchmark = 1;
              ptVar16 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (pIVar14->multithreaded == true) {
                for (; ptVar16 != ptVar5; ptVar16 = ptVar16 + 1) {
                  if ((ptVar16->_M_id)._M_thread != 0) {
                    std::thread::join();
                  }
                }
                lVar17 = 0;
                for (uVar15 = 0;
                    uVar15 < (ulong)((long)pool.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pool.
                                           super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3);
                    uVar15 = uVar15 + 1) {
                  label._M_dataplus._M_p = (pointer)0x0;
                  l.ml_._M_device = (mutex_type *)operator_new(0x30);
                  ((l.ml_._M_device)->super___mutex_base)._M_mutex.__align =
                       (long)&PTR___State_001298a8;
                  *(ThreadStats **)((long)&((l.ml_._M_device)->super___mutex_base)._M_mutex + 8) =
                       &total;
                  *(ulong *)((long)&((l.ml_._M_device)->super___mutex_base)._M_mutex + 0x10) =
                       uVar15;
                  ((l.ml_._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev = iters;
                  ((l.ml_._M_device)->super___mutex_base)._M_mutex.__data.__list.__next =
                       (__pthread_internal_list *)pIVar14;
                  l.ml_._M_device[1].super___mutex_base._M_mutex.__align =
                       (long)anon_unknown_1::RunInThread;
                  std::thread::_M_start_thread(&label,&l,0);
                  if (l.ml_._M_device != (mutex_type *)0x0) {
                    (**(code **)(((l.ml_._M_device)->super___mutex_base)._M_mutex.__align + 8))();
                  }
                  std::thread::operator=
                            ((thread *)
                             ((long)&((pool.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread
                             + lVar17),(thread *)&label);
                  std::thread::~thread((thread *)&label);
                  lVar17 = lVar17 + 8;
                }
              }
              else {
                anon_unknown_1::RunInThread(pIVar14,(size_t)iters,0,&total);
              }
              Notification::WaitForNotification((Notification *)&benchmarks);
              pTVar11 = (anonymous_namespace)::timer_manager;
              (anonymous_namespace)::running_benchmark = 0;
              std::unique_lock<std::mutex>::unique_lock
                        (&l.ml_,(mutex_type *)(anonymous_namespace)::timer_manager);
              if (pTVar11->running_ != false) {
                internal::CheckHandler::CheckHandler
                          ((CheckHandler *)&label,"!running_",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                           ,"cpu_time_used",0xc1);
LAB_00109951:
                internal::CheckHandler::~CheckHandler((CheckHandler *)&label);
              }
              internal::GetNullLogInstance();
              dVar19 = pTVar11->cpu_time_used_;
              std::unique_lock<std::mutex>::~unique_lock(&l.ml_);
              pTVar11 = (anonymous_namespace)::timer_manager;
              __p_00 = (anonymous_namespace)::timer_manager;
              std::unique_lock<std::mutex>::unique_lock
                        (&l.ml_,(mutex_type *)(anonymous_namespace)::timer_manager);
              if (pTVar11->running_ != false) {
                internal::CheckHandler::CheckHandler
                          ((CheckHandler *)&label,"!running_",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                           ,"real_time_used",0xba);
                goto LAB_00109951;
              }
              internal::GetNullLogInstance();
              dVar25 = pTVar11->real_time_used_;
              std::unique_lock<std::mutex>::~unique_lock(&l.ml_);
              std::
              __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
              ::reset((__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                       *)0x0,__p_00);
              poVar10 = internal::GetLogInstanceForLevel(2);
              poVar10 = std::operator<<(poVar10,"-- LOG(");
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
              poVar10 = std::operator<<(poVar10,"): ");
              std::operator<<(poVar10,"Ran in ");
              poVar10 = std::ostream::_M_insert<double>(dVar19);
              std::operator<<(poVar10,"/");
              poVar10 = std::ostream::_M_insert<double>(dVar25);
              std::operator<<(poVar10,"\n");
              dVar1 = dVar25;
              if (pIVar14->use_real_time == false) {
                dVar1 = dVar19;
              }
              label._M_dataplus._M_p = (pointer)&label.field_2;
              label._M_string_length = 0;
              label.field_2._M_local_buf[0] = '\0';
              __m = GetBenchmarkLock();
              std::unique_lock<std::mutex>::unique_lock(&l.ml_,&__m->mut_);
              (anonymous_namespace)::GetReportLabel_abi_cxx11_();
              std::__cxx11::string::_M_assign((string *)&label);
              std::unique_lock<std::mutex>::~unique_lock(&l.ml_);
              iVar7 = total.items_processed;
              iVar6 = total.bytes_processed;
              uVar15 = -(ulong)(ABS(pIVar14->min_time) < 2.220446049250313e-16);
              dVar3 = (double)(~uVar15 & (ulong)pIVar14->min_time |
                              (ulong)FLAGS_benchmark_min_time & uVar15);
              bVar18 = iters < (__pthread_internal_list *)0x3b9aca00;
              bVar8 = dVar25 < dVar3 * 5.0;
              if (bVar8 && ((bVar18 && iVar9 == 0) && dVar1 < dVar3)) {
                local_248 = 1e-09;
                if (1e-09 <= dVar1) {
                  local_248 = dVar1;
                }
                local_248 = (dVar3 * 1.4) / local_248;
                if (dVar1 / dVar3 <= 0.1 && 10.0 <= local_248) {
                  local_248 = 10.0;
                }
                poVar10 = internal::GetLogInstanceForLevel(3);
                poVar10 = std::operator<<(poVar10,"-- LOG(");
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,3);
                poVar10 = std::operator<<(poVar10,"): ");
                std::operator<<(poVar10,"Next iters: ");
                dVar30 = (double)(~-(ulong)(1.0 < local_248) & 0x4000000000000000 |
                                 (ulong)local_248 & -(ulong)(1.0 < local_248));
                dVar25 = dVar30 * (double)(long)iters;
                dVar19 = (double)(long)iters + 1.0;
                if (dVar19 <= dVar25) {
                  dVar19 = dVar25;
                }
                dVar25 = 1000000000.0;
                if (dVar19 <= 1000000000.0) {
                  dVar25 = dVar19;
                }
                poVar10 = std::ostream::_M_insert<double>(dVar25);
                std::operator<<(poVar10,", ");
                poVar10 = std::ostream::_M_insert<double>(dVar30);
                std::operator<<(poVar10,"\n");
                iters = (__pthread_internal_list *)(long)(int)(dVar25 + 0.5);
              }
              else {
                bVar2 = 0.0 < dVar1;
                uVar15 = (ulong)total.bytes_processed >> 0x20;
                uVar24 = (ulong)total.items_processed >> 0x20;
                l.ml_._M_device = (mutex_type *)local_1c8;
                l.ml_._M_owns = false;
                l.ml_._9_7_ = 0;
                local_1c8[0] = '\0';
                local_1c8._16_8_ = &local_1a8;
                local_1c8._24_8_ = (__pthread_internal_list *)0x0;
                local_1a8._M_local_buf[0] = '\0';
                local_198 = 1;
                local_180 = 0.0;
                dStack_178 = 0.0;
                local_190 = 0.0;
                dStack_188 = 0.0;
                local_170 = 0.0;
                std::__cxx11::string::_M_assign((string *)&l.ml_);
                std::__cxx11::string::_M_assign((string *)(local_1c8 + 0x10));
                auVar4._8_8_ = iVar7;
                auVar4._0_8_ = iVar6;
                auVar20 = auVar4 ^ _DAT_0011b170;
                auVar26._0_4_ = -(uint)((int)DAT_0011b170 < auVar20._0_4_);
                iVar28 = -(uint)(DAT_0011b170._4_4_ < auVar20._4_4_);
                auVar26._8_4_ = -(uint)(DAT_0011b170._8_4_ < auVar20._8_4_);
                iVar29 = -(uint)(DAT_0011b170._12_4_ < auVar20._12_4_);
                auVar21._4_4_ = -(uint)(auVar20._4_4_ == DAT_0011b170._4_4_);
                auVar21._12_4_ = -(uint)(auVar20._12_4_ == DAT_0011b170._12_4_);
                auVar21._0_4_ = auVar21._4_4_;
                auVar21._8_4_ = auVar21._12_4_;
                auVar22._1_3_ = 0;
                auVar22[0] = bVar2;
                auVar26._4_4_ = auVar26._0_4_;
                auVar26._12_4_ = auVar26._8_4_;
                auVar20._4_4_ = iVar28;
                auVar20._0_4_ = iVar28;
                auVar20._8_4_ = iVar29;
                auVar20._12_4_ = iVar29;
                auVar22[4] = bVar2;
                auVar22._5_3_ = 0;
                auVar22[8] = bVar2;
                auVar22._9_3_ = 0;
                auVar22[0xc] = bVar2;
                auVar22._13_3_ = 0;
                auVar22 = auVar22 & (auVar26 & auVar21 | auVar20);
                auVar23._0_8_ =
                     CONCAT44((auVar22._4_4_ << 0x1f) >> 0x1f,(auVar22._0_4_ << 0x1f) >> 0x1f);
                auVar23._8_4_ = (auVar22._8_4_ << 0x1f) >> 0x1f;
                auVar23._12_4_ = (auVar22._12_4_ << 0x1f) >> 0x1f;
                auVar20 = auVar4 & _DAT_0011b180 | _DAT_0011b190;
                auVar31._0_8_ =
                     auVar20._0_8_ +
                     ((double)(uVar15 | 0x4530000000000000) - 1.9342813118337666e+25);
                auVar31._8_8_ =
                     auVar20._8_8_ +
                     ((double)(uVar24 | 0x4530000000000000) - 1.9342813118337666e+25);
                auVar27._8_8_ = dVar1;
                auVar27._0_8_ = dVar1;
                auVar20 = divpd(auVar31,auVar27);
                local_180 = (double)(auVar20._0_8_ & auVar23._0_8_);
                dStack_178 = (double)(auVar20._8_8_ & auVar23._8_8_);
                local_198 = (long)pIVar14->threads * (long)iters;
                local_190 = dVar25;
                dStack_188 = dVar19;
                std::
                vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ::push_back(&reports,(value_type *)&l);
                BenchmarkReporter::Run::~Run((Run *)&l);
              }
              std::__cxx11::string::~string((string *)&label);
              std::condition_variable::~condition_variable(local_90);
            } while (bVar8 && ((bVar18 && iVar9 == 0) && dVar1 < dVar3));
            std::__cxx11::string::~string((string *)&mem);
          }
          (*reporter->_vptr_BenchmarkReporter[1])(reporter,&reports);
          ptVar5 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          ptVar16 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pIVar14->multithreaded == true) {
            for (; ptVar16 != ptVar5; ptVar16 = ptVar16 + 1) {
              std::thread::join();
            }
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&pool);
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector(&reports);
        }
      }
    }
    std::
    vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ::~vector(&benchmarks_1);
  }
  (*reporter->_vptr_BenchmarkReporter[2])(reporter);
  if (local_260 != (BenchmarkReporter *)0x0) {
    (*local_260->_vptr_BenchmarkReporter[4])();
  }
  std::__cxx11::string::~string((string *)&spec);
  return;
}

Assistant:

void RunSpecifiedBenchmarks(BenchmarkReporter* reporter) {
  if (FLAGS_benchmark_list_tests) {
    internal::PrintBenchmarkList();
    return;
  }
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::unique_ptr<BenchmarkReporter> default_reporter;
  if (!reporter) {
    default_reporter = internal::GetDefaultReporter();
    reporter = default_reporter.get();
  }
  internal::RunMatchingBenchmarks(spec, reporter);
  reporter->Finalize();
}